

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find(StringPiece *this,StringPiece s,size_type pos)

{
  char *pcVar1;
  long local_48;
  char *result;
  size_type pos_local;
  StringPiece *this_local;
  StringPiece s_local;
  
  if ((this->length_ < 1) || ((ulong)this->length_ < pos)) {
    if (((this->length_ == 0) && (pos == 0)) && (s.length_ == 0)) {
      s_local.length_ = 0;
    }
    else {
      s_local.length_ = -1;
    }
  }
  else {
    pcVar1 = std::search<char_const*,char_const*>
                       (this->ptr_ + pos,this->ptr_ + this->length_,s.ptr_,s.ptr_ + s.length_);
    if (pcVar1 == this->ptr_ + this->length_) {
      local_48 = -1;
    }
    else {
      local_48 = (long)pcVar1 - (long)this->ptr_;
    }
    s_local.length_ = local_48;
  }
  return s_local.length_;
}

Assistant:

stringpiece_ssize_type StringPiece::find(StringPiece s, size_type pos) const {
  if (length_ <= 0 || pos > static_cast<size_type>(length_)) {
    if (length_ == 0 && pos == 0 && s.length_ == 0) return 0;
    return npos;
  }
  const char *result = std::search(ptr_ + pos, ptr_ + length_,
                                   s.ptr_, s.ptr_ + s.length_);
  return result == ptr_ + length_ ? npos : result - ptr_;
}